

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::tighten(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Tolerances *this_00;
  bool bVar5;
  undefined8 uVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  dVar2 = peVar3->s_epsilon_multiplier;
  uVar9 = -(ulong)(dVar2 == 1.0);
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,
             (double)(~uVar9 & (ulong)(dVar2 * 1e-05) | uVar9 & 0x3ee4f8b588e368f1));
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  pnVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta;
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  if (&local_128 != &pnVar1->m_backend) {
    local_128.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_128.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).delta.m_backend.data._M_elems + 2);
    local_128.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).delta.m_backend.data._M_elems + 4);
    local_128.data._M_elems._24_8_ =
         *(undefined8 *)
          ((this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).delta.m_backend.data._M_elems + 6);
    local_128.data._M_elems._32_8_ =
         *(undefined8 *)
          ((this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).delta.m_backend.data._M_elems + 8);
    local_128.data._M_elems._40_8_ =
         *(undefined8 *)
          ((this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).delta.m_backend.data._M_elems + 10);
    local_128.data._M_elems._48_8_ =
         *(undefined8 *)
          ((this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).delta.m_backend.data._M_elems + 0xc);
    uVar6 = *(undefined8 *)
             ((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta.m_backend.data._M_elems + 0xe);
    local_128.data._M_elems._56_5_ = SUB85(uVar6,0);
    local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_128.exp =
         (this->
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).delta.m_backend.exp;
    local_128.neg =
         (this->
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).delta.m_backend.neg;
    local_128.fpclass =
         (this->
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).delta.m_backend.fpclass;
    local_128.prec_elem =
         (this->
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).delta.m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_128,&local_d8);
  if (((this->fastDelta).m_backend.fpclass != cpp_dec_float_NaN) &&
     (local_128.fpclass != cpp_dec_float_NaN)) {
    pnVar1 = &this->fastDelta;
    iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&pnVar1->m_backend,&local_128);
    if (-1 < iVar7) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&pnVar1->m_backend,&local_d8);
      peVar3 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var4 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      bVar5 = false;
      if (((this->fastDelta).m_backend.fpclass != cpp_dec_float_NaN) &&
         (dVar2 = peVar3->s_epsilon_multiplier, uVar9 = -(ulong)(dVar2 == 1.0),
         dVar2 = (double)(~uVar9 & (ulong)(dVar2 * 0.0001) | uVar9 & 0x3f1a36e2eb1c432d),
         !NAN(dVar2))) {
        local_128.fpclass = cpp_dec_float_finite;
        local_128.prec_elem = 0x10;
        local_128.data._M_elems[0] = 0;
        local_128.data._M_elems[1] = 0;
        local_128.data._M_elems[2] = 0;
        local_128.data._M_elems[3] = 0;
        local_128.data._M_elems[4] = 0;
        local_128.data._M_elems[5] = 0;
        local_128.data._M_elems[6] = 0;
        local_128.data._M_elems[7] = 0;
        local_128.data._M_elems[8] = 0;
        local_128.data._M_elems[9] = 0;
        local_128.data._M_elems[10] = 0;
        local_128.data._M_elems[0xb] = 0;
        local_128.data._M_elems[0xc] = 0;
        local_128.data._M_elems[0xd] = 0;
        local_128.data._M_elems._56_5_ = 0;
        local_128.data._M_elems[0xf]._1_3_ = 0;
        local_128.exp = 0;
        local_128.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_128,dVar2);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&pnVar1->m_backend,&local_128);
        bVar5 = 0 < iVar7;
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      if (bVar5) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_128,2,(type *)0x0);
        local_88.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
        local_88.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
        local_88.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
        local_88.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
        local_88.data._M_elems[8] = local_d8.data._M_elems[8];
        local_88.data._M_elems[9] = local_d8.data._M_elems[9];
        local_88.data._M_elems[10] = local_d8.data._M_elems[10];
        local_88.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
        local_88.data._M_elems[4] = local_d8.data._M_elems[4];
        local_88.data._M_elems[5] = local_d8.data._M_elems[5];
        local_88.data._M_elems[6] = local_d8.data._M_elems[6];
        local_88.data._M_elems[7] = local_d8.data._M_elems[7];
        local_88.data._M_elems[0] = local_d8.data._M_elems[0];
        local_88.data._M_elems[1] = local_d8.data._M_elems[1];
        local_88.data._M_elems[2] = local_d8.data._M_elems[2];
        local_88.data._M_elems[3] = local_d8.data._M_elems[3];
        local_88.exp = local_d8.exp;
        local_88.neg = local_d8.neg;
        local_88.fpclass = local_d8.fpclass;
        local_88.prec_elem = local_d8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_88,&local_128);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&pnVar1->m_backend,&local_88);
      }
    }
  }
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  pnVar1 = &this->minStab;
  bVar8 = 0;
  if (((this->minStab).m_backend.fpclass != cpp_dec_float_NaN) &&
     (dVar2 = peVar3->s_epsilon_multiplier, uVar9 = -(ulong)(dVar2 == 1.0),
     dVar2 = (double)(~uVar9 & (ulong)(dVar2 * 1e-05) | uVar9 & 0x3ee4f8b588e368f1), bVar8 = 0,
     !NAN(dVar2))) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_128,dVar2);
    iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&pnVar1->m_backend,&local_128);
    bVar8 = (byte)((uint)iVar7 >> 0x1f);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (bVar8 != 0) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_128,0.9);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator/=
              (&pnVar1->m_backend,&local_128);
    this_00 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    p_Var4 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    a = Tolerances::floatingPointFeastol(this_00);
    bVar8 = 0;
    if ((!NAN(a)) && ((this->minStab).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_128,a);
      iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&pnVar1->m_backend,&local_128);
      bVar8 = (byte)((uint)iVar7 >> 0x1f);
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (bVar8 != 0) {
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_128,0.9);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator/=
                (&pnVar1->m_backend,&local_128);
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}